

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void __thiscall CodeGenGenericContext::KillRegister(CodeGenGenericContext *this,x86Reg reg)

{
  x86Instruction *curr;
  x86Reg reg_local;
  CodeGenGenericContext *this_local;
  
  if (((this->genRegRead[reg] & 1U) == 0) && (this->x86Base[this->genRegUpdate[reg]].name != o_none)
     ) {
    this->x86Base[this->genRegUpdate[reg]].name = o_none;
    this->optimizationCount = this->optimizationCount + 1;
  }
  this->genReg[reg].type = argNone;
  return;
}

Assistant:

void CodeGenGenericContext::KillRegister(x86Reg reg)
{
	// Eliminate dead stores to the register
	if(!genRegRead[reg])
	{
		x86Instruction *curr = genRegUpdate[reg] + x86Base;

		if(curr->name != o_none)
		{
			curr->name = o_none;
			optimizationCount++;
		}
	}

	// Invalidate the register value
	genReg[reg].type = x86Argument::argNone;
}